

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_Error tt_cmap4_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  FT_Byte FVar3;
  byte bVar4;
  undefined2 uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  ushort *puVar13;
  ushort *puVar14;
  uint uVar15;
  byte *pbVar16;
  uint uVar17;
  ushort *puVar18;
  FT_Byte *pFVar19;
  uint uVar20;
  ulong uVar21;
  byte *pbVar22;
  ulong uVar23;
  uint local_5c;
  uint local_50;
  
  if (valid->limit < table + 4) {
    ft_validator_error(valid,8);
  }
  uVar23 = (ulong)(ushort)(*(ushort *)(table + 2) << 8 | *(ushort *)(table + 2) >> 8);
  if (valid->limit < table + uVar23) {
    if (valid->level != FT_VALIDATE_DEFAULT) {
      ft_validator_error(valid,8);
    }
    uVar23 = (ulong)(uint)((int)valid->limit - (int)table);
  }
  if ((uint)uVar23 < 0x10) {
    ft_validator_error(valid,8);
  }
  bVar1 = table[6];
  bVar2 = table[7];
  uVar12 = (uint)bVar1 * 0x100 + (uint)bVar2;
  if ((bVar2 & 1) != 0 && FT_VALIDATE_TIGHT < valid->level) {
    ft_validator_error(valid,8);
  }
  uVar20 = uVar12 & 0xfffffffe;
  if ((uint)uVar23 < uVar20 * 4 + 0x10) {
    ft_validator_error(valid,8);
  }
  uVar12 = uVar12 >> 1;
  if (FT_VALIDATE_TIGHT < valid->level) {
    uVar6 = CONCAT11(table[8],table[9]);
    uVar5 = *(undefined2 *)(table + 10);
    FVar3 = table[0xc];
    bVar4 = table[0xd];
    if (((table[9] | bVar4) & 1) != 0) {
      ft_validator_error(valid,8);
    }
    uVar8 = (uint)(uVar6 >> 1);
    if ((((uVar12 < uVar8) || ((uVar6 & 0xfffffffe) < uVar12)) ||
        ((ushort)(CONCAT11(FVar3,bVar4) >> 1) + uVar8 != uVar12)) ||
       (uVar8 != 1 << ((byte)((ushort)uVar5 >> 8) & 0x1f))) {
      ft_validator_error(valid,8);
    }
  }
  puVar13 = (ushort *)(table + 0xe);
  uVar21 = (ulong)uVar20;
  puVar14 = (ushort *)(table + uVar21 * 2 + 0x10);
  pbVar22 = (byte *)((long)puVar14 + uVar21);
  if ((FT_VALIDATE_TIGHT < valid->level) &&
     (uVar6 = *(ushort *)((long)puVar13 + (ulong)(uVar20 - 2)),
     (ushort)(uVar6 << 8 | uVar6 >> 8) != 0xffff)) {
    ft_validator_error(valid,8);
  }
  puVar18 = (ushort *)(table + uVar21 + 0x10);
  pbVar16 = pbVar22 + uVar21;
  uVar8 = (uint)(ushort)(CONCAT11(bVar1,bVar2) >> 1);
  pFVar19 = table + (ulong)uVar8 * 6 + 0x11;
  local_5c = 0;
  uVar10 = 0;
  local_50 = 0;
  uVar20 = 0;
  do {
    if (uVar10 == uVar8) {
      return local_5c;
    }
    uVar7 = *puVar18 << 8 | *puVar18 >> 8;
    uVar15 = (uint)(ushort)(*puVar13 << 8 | *puVar13 >> 8);
    uVar6 = *puVar14;
    bVar1 = *pbVar22;
    bVar2 = pbVar22[1];
    uVar17 = (uint)uVar7;
    iVar9 = uVar15 - uVar7;
    if (uVar15 < uVar17) {
      ft_validator_error(valid,8);
    }
    if ((uVar10 != 0) && (uVar17 <= uVar20)) {
      if (valid->level == FT_VALIDATE_DEFAULT) {
        if ((uVar17 < local_50) || (uVar15 < uVar20)) {
          local_5c = local_5c | 1;
        }
        else {
          local_5c = local_5c | 2;
        }
      }
      else {
        ft_validator_error(valid,8);
      }
    }
    uVar20 = (uint)bVar1 * 0x100 + (uint)bVar2;
    if (uVar20 != 0) {
      if (uVar20 == 0xffff) {
        if ((((FT_VALIDATE_TIGHT < valid->level) || (uVar10 != uVar12 - 1)) || (uVar17 != 0xffff))
           || (uVar15 != 0xffff)) {
          ft_validator_error(valid,8);
        }
      }
      else {
        pbVar11 = pbVar22 + uVar20;
        if (valid->level == FT_VALIDATE_DEFAULT) {
          if ((((uVar10 != uVar12 - 1) || (uVar17 != 0xffff)) || (uVar15 != 0xffff)) &&
             ((pbVar11 < pbVar16 || (valid->limit < pbVar11 + (iVar9 * 2 + 2))))) goto LAB_0021307e;
        }
        else if ((pbVar11 < pbVar16) || (table + uVar23 < pbVar11 + (iVar9 * 2 + 2))) {
LAB_0021307e:
          ft_validator_error(valid,8);
        }
        if (valid->level != FT_VALIDATE_DEFAULT) {
          uVar21 = (ulong)((uint)bVar1 * 0x100 + (uint)bVar2);
          for (uVar20 = uVar17; uVar20 < uVar15; uVar20 = uVar20 + 1) {
            if ((CONCAT11(pbVar22[uVar21],pFVar19[uVar21]) != 0) &&
               ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <=
                (uint)(ushort)(CONCAT11(pbVar22[uVar21],pFVar19[uVar21]) + (uVar6 << 8 | uVar6 >> 8)
                              ))) {
              ft_validator_error(valid,0x10);
            }
            uVar21 = uVar21 + 2;
          }
        }
      }
    }
    puVar18 = puVar18 + 1;
    puVar13 = puVar13 + 1;
    puVar14 = puVar14 + 1;
    pbVar22 = pbVar22 + 2;
    uVar10 = uVar10 + 1;
    pFVar19 = pFVar19 + 2;
    uVar20 = uVar15;
    local_50 = uVar17;
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap4_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length;

    FT_Byte   *ends, *starts, *offsets, *deltas, *glyph_ids;
    FT_UInt   num_segs;
    FT_Error  error = FT_Err_Ok;


    if ( table + 2 + 2 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;           /* skip format */
    length = TT_NEXT_USHORT( p );

    /* in certain fonts, the `length' field is invalid and goes */
    /* out of bound.  We try to correct this here...            */
    if ( table + length > valid->limit )
    {
      if ( valid->level >= FT_VALIDATE_TIGHT )
        FT_INVALID_TOO_SHORT;

      length = (FT_UInt)( valid->limit - table );
    }

    if ( length < 16 )
      FT_INVALID_TOO_SHORT;

    p        = table + 6;
    num_segs = TT_NEXT_USHORT( p );   /* read segCountX2 */

    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      /* check that we have an even value here */
      if ( num_segs & 1 )
        FT_INVALID_DATA;
    }

    num_segs /= 2;

    if ( length < 16 + num_segs * 2 * 4 )
      FT_INVALID_TOO_SHORT;

    /* check the search parameters - even though we never use them */
    /*                                                             */
    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      /* check the values of `searchRange', `entrySelector', `rangeShift' */
      FT_UInt  search_range   = TT_NEXT_USHORT( p );
      FT_UInt  entry_selector = TT_NEXT_USHORT( p );
      FT_UInt  range_shift    = TT_NEXT_USHORT( p );


      if ( ( search_range | range_shift ) & 1 )  /* must be even values */
        FT_INVALID_DATA;

      search_range /= 2;
      range_shift  /= 2;

      /* `search range' is the greatest power of 2 that is <= num_segs */

      if ( search_range                > num_segs                 ||
           search_range * 2            < num_segs                 ||
           search_range + range_shift != num_segs                 ||
           search_range               != ( 1U << entry_selector ) )
        FT_INVALID_DATA;
    }

    ends      = table   + 14;
    starts    = table   + 16 + num_segs * 2;
    deltas    = starts  + num_segs * 2;
    offsets   = deltas  + num_segs * 2;
    glyph_ids = offsets + num_segs * 2;

    /* check last segment; its end count value must be 0xFFFF */
    if ( valid->level >= FT_VALIDATE_PARANOID )
    {
      p = ends + ( num_segs - 1 ) * 2;
      if ( TT_PEEK_USHORT( p ) != 0xFFFFU )
        FT_INVALID_DATA;
    }

    {
      FT_UInt   start, end, offset, n;
      FT_UInt   last_start = 0, last_end = 0;
      FT_Int    delta;
      FT_Byte*  p_start   = starts;
      FT_Byte*  p_end     = ends;
      FT_Byte*  p_delta   = deltas;
      FT_Byte*  p_offset  = offsets;


      for ( n = 0; n < num_segs; n++ )
      {
        p      = p_offset;
        start  = TT_NEXT_USHORT( p_start );
        end    = TT_NEXT_USHORT( p_end );
        delta  = TT_NEXT_SHORT( p_delta );
        offset = TT_NEXT_USHORT( p_offset );

        if ( start > end )
          FT_INVALID_DATA;

        /* this test should be performed at default validation level; */
        /* unfortunately, some popular Asian fonts have overlapping   */
        /* ranges in their charmaps                                   */
        /*                                                            */
        if ( start <= last_end && n > 0 )
        {
          if ( valid->level >= FT_VALIDATE_TIGHT )
            FT_INVALID_DATA;
          else
          {
            /* allow overlapping segments, provided their start points */
            /* and end points, respectively, are in ascending order    */
            /*                                                         */
            if ( last_start > start || last_end > end )
              error |= TT_CMAP_FLAG_UNSORTED;
            else
              error |= TT_CMAP_FLAG_OVERLAPPING;
          }
        }

        if ( offset && offset != 0xFFFFU )
        {
          p += offset;  /* start of glyph ID array */

          /* check that we point within the glyph IDs table only */
          if ( valid->level >= FT_VALIDATE_TIGHT )
          {
            if ( p < glyph_ids                                ||
                 p + ( end - start + 1 ) * 2 > table + length )
              FT_INVALID_DATA;
          }
          /* Some fonts handle the last segment incorrectly.  In */
          /* theory, 0xFFFF might point to an ordinary glyph --  */
          /* a cmap 4 is versatile and could be used for any     */
          /* encoding, not only Unicode.  However, reality shows */
          /* that far too many fonts are sloppy and incorrectly  */
          /* set all fields but `start' and `end' for the last   */
          /* segment if it contains only a single character.     */
          /*                                                     */
          /* We thus omit the test here, delaying it to the      */
          /* routines that actually access the cmap.             */
          else if ( n != num_segs - 1                       ||
                    !( start == 0xFFFFU && end == 0xFFFFU ) )
          {
            if ( p < glyph_ids                              ||
                 p + ( end - start + 1 ) * 2 > valid->limit )
              FT_INVALID_DATA;
          }

          /* check glyph indices within the segment range */
          if ( valid->level >= FT_VALIDATE_TIGHT )
          {
            FT_UInt  i, idx;


            for ( i = start; i < end; i++ )
            {
              idx = FT_NEXT_USHORT( p );
              if ( idx != 0 )
              {
                idx = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;

                if ( idx >= TT_VALID_GLYPH_COUNT( valid ) )
                  FT_INVALID_GLYPH_ID;
              }
            }
          }
        }
        else if ( offset == 0xFFFFU )
        {
          /* some fonts (erroneously?) use a range offset of 0xFFFF */
          /* to mean missing glyph in cmap table                    */
          /*                                                        */
          if ( valid->level >= FT_VALIDATE_PARANOID    ||
               n != num_segs - 1                       ||
               !( start == 0xFFFFU && end == 0xFFFFU ) )
            FT_INVALID_DATA;
        }

        last_start = start;
        last_end   = end;
      }
    }

    return error;
  }